

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushItemWidth(float item_width)

{
  ImGuiContext *pIVar1;
  float in_XMM0_Da;
  ImGuiWindow *window;
  ImGuiContext *g;
  float *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  pIVar1 = GImGui;
  if ((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) {
    in_XMM0_Da = GImGui->CurrentWindow->ItemWidthDefault;
  }
  (GImGui->CurrentWindow->DC).ItemWidth = in_XMM0_Da;
  ImVector<float>::push_back
            ((ImVector<float> *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  (pIVar1->NextItemData).Flags = (pIVar1->NextItemData).Flags & 0xfffffffe;
  return;
}

Assistant:

void ImGui::PushItemWidth(float item_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.ItemWidth = (item_width == 0.0f ? window->ItemWidthDefault : item_width);
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth);
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}